

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmt_bin_decode_nvidia.c
# Opt level: O3

uint load_memory_dump(uint pfx,mmt_memory_dump_prefix **dump,mmt_buf **buf,
                     mmt_nvidia_decode_funcs *funcs)

{
  char cVar1;
  uint32_t uVar2;
  _func_void_mmt_nvidia_gpu_map_ptr_void_ptr *p_Var3;
  _func_void_mmt_nvidia_gpu_unmap_ptr_void_ptr *p_Var4;
  _func_void_mmt_nvidia_bind_ptr_void_ptr *p_Var5;
  uint uVar6;
  char *pcVar7;
  void *pvVar8;
  mmt_memory_dump_prefix *pmVar9;
  mmt_buf *pmVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  
  iVar11 = 0;
  *dump = (mmt_memory_dump_prefix *)0x0;
  *buf = (mmt_buf *)0x0;
  do {
    pcVar7 = (char *)mmt_load_data_with_prefix(1,pfx,1);
    if ((pcVar7 == (char *)0x0) || (*pcVar7 != 'n')) {
      return 0;
    }
    mmt_load_data_with_prefix(2,pfx,0);
    pvVar8 = mmt_load_data_with_prefix(2,pfx,0);
    if (pvVar8 == (void *)0x0) {
      return 0;
    }
    cVar1 = *(char *)((long)pvVar8 + 1);
    switch(cVar1) {
    case 'a':
      p_Var4 = (_func_void_mmt_nvidia_gpu_unmap_ptr_void_ptr *)funcs->alloc_map;
      goto joined_r0x00103218;
    case 'b':
      p_Var5 = funcs->bind;
      goto joined_r0x00103261;
    case 'c':
      if (funcs->create_object != (_func_void_mmt_nvidia_create_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      uVar6 = load_create_object((mmt_nvidia_create_object **)0x0,pfx);
      goto LAB_001032ad;
    case 'd':
      p_Var5 = (_func_void_mmt_nvidia_bind_ptr_void_ptr *)funcs->destroy_object;
joined_r0x00103261:
      if (p_Var5 != (_func_void_mmt_nvidia_bind_ptr_void_ptr *)0x0) {
        return 0;
      }
LAB_00103267:
      uVar6 = 0xb;
      mmt_load_data_with_prefix(0xb,pfx,0);
      uVar12 = pfx + 0xb;
      break;
    case 'e':
      p_Var4 = (_func_void_mmt_nvidia_gpu_unmap_ptr_void_ptr *)funcs->unmap;
      goto joined_r0x00103218;
    case 'f':
    case 'i':
    case 'j':
    case 'k':
    case 'n':
    case 'q':
    case 's':
    case 'u':
    case 'w':
      return 0;
    case 'g':
      p_Var3 = funcs->gpu_map;
joined_r0x001030f9:
      if (p_Var3 != (_func_void_mmt_nvidia_gpu_map_ptr_void_ptr *)0x0) {
        return 0;
      }
      goto LAB_001031f2;
    case 'h':
      p_Var4 = funcs->gpu_unmap;
joined_r0x00103218:
      if (p_Var4 != (_func_void_mmt_nvidia_gpu_unmap_ptr_void_ptr *)0x0) {
        return 0;
      }
LAB_0010322e:
      uVar6 = 0x13;
      mmt_load_data_with_prefix(0x13,pfx,0);
      uVar12 = pfx + 0x13;
      break;
    case 'l':
      if (funcs->call_method != (_func_void_mmt_nvidia_call_method_ptr_void_ptr *)0x0) {
        return 0;
      }
      goto LAB_00103267;
    case 'm':
      uVar6 = 0x2f;
      mmt_load_data_with_prefix(0x2f,pfx,0);
      uVar12 = pfx + 0x2f;
      break;
    case 'o':
      goto switchD_001030c8_caseD_6f;
    case 'p':
      if (funcs->create_mapped != (_func_void_mmt_nvidia_create_mapped_object_ptr_void_ptr *)0x0) {
        return 0;
      }
LAB_001031f2:
      uVar6 = 0x17;
      mmt_load_data_with_prefix(0x17,pfx,0);
      uVar12 = pfx + 0x17;
      break;
    case 'r':
      if (funcs->create_driver_object !=
          (_func_void_mmt_nvidia_create_driver_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      goto LAB_0010322e;
    case 't':
      if (funcs->create_dma_object != (_func_void_mmt_nvidia_create_dma_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      uVar6 = 0xf;
      mmt_load_data_with_prefix(0xf,pfx,0);
      uVar12 = pfx + 0xf;
      break;
    case 'v':
      if (funcs->create_device_object !=
          (_func_void_mmt_nvidia_create_device_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_create_device_object((mmt_nvidia_create_device_object **)0x0,pfx);
      goto LAB_001031b5;
    case 'x':
      if (funcs->create_context_object !=
          (_func_void_mmt_nvidia_create_context_object_ptr_void_ptr *)0x0) {
        return 0;
      }
      load_create_context_object((mmt_nvidia_create_context_object **)0x0,pfx);
LAB_001031b5:
      uVar6 = 7;
      goto LAB_001032ad;
    default:
      if (cVar1 != 'G') {
        if (cVar1 != 'H') {
          return 0;
        }
        p_Var3 = (_func_void_mmt_nvidia_gpu_map_ptr_void_ptr *)funcs->gpu_unmap2;
        goto joined_r0x001030f9;
      }
      if (funcs->gpu_map2 != (_func_void_mmt_nvidia_gpu_map2_ptr_void_ptr *)0x0) {
        return 0;
      }
      uVar6 = 0x1b;
      mmt_load_data_with_prefix(0x1b,pfx,0);
      uVar12 = pfx + 0x1b;
    }
    mmt_check_eor(uVar12);
LAB_001032ad:
    iVar11 = iVar11 + uVar6;
    pfx = pfx + uVar6;
  } while (*(char *)((long)pvVar8 + 1) != 'o');
switchD_001030c8_caseD_6f:
  pvVar8 = mmt_load_data_with_prefix(0xe,pfx,0);
  mmt_buf_check_sanity((mmt_buf *)((long)pvVar8 + 10));
  iVar13 = *(int *)((long)pvVar8 + 10);
  pmVar9 = (mmt_memory_dump_prefix *)mmt_load_data_with_prefix(iVar13 + 0xe,pfx,0);
  uVar12 = iVar13 + pfx + 0xe;
  pmVar10 = (mmt_buf *)mmt_load_data_with_prefix(4,uVar12,0);
  mmt_buf_check_sanity(pmVar10);
  uVar2 = pmVar10->len;
  pmVar10 = (mmt_buf *)mmt_load_data_with_prefix(uVar2 + 5,uVar12,0);
  iVar13 = uVar2 + iVar13 + 0x13;
  mmt_check_eor(pfx + iVar13);
  *dump = pmVar9;
  *buf = pmVar10;
  return iVar11 + iVar13;
}

Assistant:

static unsigned int load_memory_dump(unsigned int pfx, struct mmt_memory_dump_prefix **dump,
		struct mmt_buf **buf, struct mmt_nvidia_decode_funcs *funcs)
{
	unsigned int size1, size2, omitted = 0;
	struct mmt_memory_dump_prefix *d;
	struct mmt_buf *b;
	*dump = NULL;
	*buf = NULL;
	struct mmt_message_nv *nv;

	do
	{
		struct mmt_message *msg = mmt_load_data_with_prefix(1, pfx, 1);
		if (msg == NULL || msg->type != 'n')
			return 0;

		mmt_load_data_with_prefix(sizeof(struct mmt_message_nv), pfx, 0);

		nv = mmt_load_data_with_prefix(sizeof(struct mmt_message_nv), pfx, 0);
		if (nv == NULL)
			return 0;

		if (nv->subtype != 'o')
		{
			unsigned int omit;
			if (nv->subtype == 'c' && funcs->create_object == NULL)
				omit = load_create_object(NULL, pfx);
			else if (nv->subtype == 'd' && funcs->destroy_object == NULL)
				omit = load_destroy_object(NULL, pfx);
			else if (nv->subtype == 'l' && funcs->call_method == NULL)
				omit = load_call_method(NULL, pfx);
			else if (nv->subtype == 'p' && funcs->create_mapped == NULL)
				omit = load_create_mapped_object(NULL, pfx);
			else if (nv->subtype == 't' && funcs->create_dma_object == NULL)
				omit = load_create_dma_object(NULL, pfx);
			else if (nv->subtype == 'a' && funcs->alloc_map == NULL)
				omit = load_alloc_map(NULL, pfx);
			else if (nv->subtype == 'g' && funcs->gpu_map == NULL)
				omit = load_gpu_map(NULL, pfx);
			else if (nv->subtype == 'G' && funcs->gpu_map2 == NULL)
				omit = load_gpu_map2(NULL, pfx);
			else if (nv->subtype == 'h' && funcs->gpu_unmap == NULL)
				omit = load_gpu_unmap(NULL, pfx);
			else if (nv->subtype == 'H' && funcs->gpu_unmap2 == NULL)
				omit = load_gpu_unmap2(NULL, pfx);
			else if (nv->subtype == 'm' /*&& funcs->mmap == NULL*/)
				omit = load_mmap(NULL, pfx);
			else if (nv->subtype == 'e' && funcs->unmap == NULL)
				omit = load_unmap(NULL, pfx);
			else if (nv->subtype == 'b' && funcs->bind == NULL)
				omit = load_bind(NULL, pfx);
			else if (nv->subtype == 'r' && funcs->create_driver_object == NULL)
				omit = load_create_driver_object(NULL, pfx);
			else if (nv->subtype == 'v' && funcs->create_device_object == NULL)
				omit = load_create_device_object(NULL, pfx);
			else if (nv->subtype == 'x' && funcs->create_context_object == NULL)
				omit = load_create_context_object(NULL, pfx);
			else
			{
				//if (nv->subtype != 'j' && nv->subtype != 'i')
				//	printf("%d '%c'\n", nv->subtype, nv->subtype);
				return 0;
			}

			omitted += omit;
			pfx += omit;
		}
	}
	while (nv->subtype != 'o');

	size1 = sizeof(struct mmt_memory_dump_prefix);
	d = mmt_load_data_with_prefix(size1, pfx, 0);
	mmt_buf_check_sanity(&d->str);
	size1 += d->str.len;
	d = mmt_load_data_with_prefix(size1, pfx, 0);

	size2 = 4;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);
	mmt_buf_check_sanity(b);
	size2 += b->len + 1;
	b = mmt_load_data_with_prefix(size2, size1 + pfx, 0);

	mmt_check_eor(size2 + size1 + pfx);

	*dump = d;
	*buf = b;

	return size1 + size2 + omitted;
}